

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O1

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::ReadPackedFixed<int>
          (EpsCopyInputStream *this,char *ptr,int size,RepeatedField<int> *out)

{
  bool bVar1;
  int iVar2;
  pointer piVar3;
  char *pcVar4;
  LogMessage *pLVar5;
  uint uVar6;
  uint uVar7;
  int n;
  SooRep *local_50;
  int local_44;
  LogMessage local_40 [16];
  
  if (ptr != (char *)0x0) {
    uVar7 = (*(int *)&this->buffer_end_ - (int)ptr) + 0x10;
    local_50 = &out->soo_rep_;
    do {
      if (size <= (int)uVar7) {
        uVar7 = size & 0xfffffffc;
        if (3 < (uint)size) {
          n = size >> 2;
          iVar2 = SooRep::size(local_50,(undefined1  [16])
                                        ((undefined1  [16])local_50->field_0 & (undefined1  [16])0x4
                                        ) == (undefined1  [16])0x0);
          RepeatedField<int>::Reserve((RepeatedField<int> *)local_50,iVar2 + n);
          piVar3 = RepeatedField<int>::AddNAlreadyReserved((RepeatedField<int> *)local_50,n);
          if (piVar3 == (pointer)0x0) {
            absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)local_40,
                       "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/parse_context.h"
                       ,0x4a6,0xe,"dst != nullptr");
            pLVar5 = absl::lts_20240722::log_internal::LogMessage::
                     operator<<<google::protobuf::RepeatedField<int>_*,_0>
                               (local_40,(RepeatedField<int> **)&local_50);
            absl::lts_20240722::log_internal::LogMessage::
            CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
                      (pLVar5,1,",");
            local_44 = n;
            _ZN4absl12lts_2024072212log_internal10LogMessagelsIiTnNSt9enable_ifIXntsr4absl16HasAbslStringifyIT_EE5valueEiE4typeELi0EEERS2_RKS5_
                      (pLVar5);
            absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)local_40);
          }
          memcpy(piVar3,ptr,(long)(int)uVar7);
          ptr = ptr + (int)uVar7;
        }
        if (size != uVar7) {
          return (char *)0x0;
        }
        return ptr;
      }
      iVar2 = SooRep::size(local_50,(undefined1  [16])
                                    ((undefined1  [16])local_50->field_0 & (undefined1  [16])0x4) ==
                                    (undefined1  [16])0x0);
      RepeatedField<int>::Reserve((RepeatedField<int> *)local_50,iVar2 + ((int)uVar7 >> 2));
      uVar6 = uVar7 & 0xfffffffc;
      piVar3 = RepeatedField<int>::AddNAlreadyReserved
                         ((RepeatedField<int> *)local_50,(int)uVar7 >> 2);
      memcpy(piVar3,ptr,(long)(int)uVar6);
      if (this->limit_ < 0x11) {
        bVar1 = false;
      }
      else {
        pcVar4 = Next(this);
        if (pcVar4 == (char *)0x0) {
          bVar1 = false;
          ptr = (char *)0x0;
        }
        else {
          ptr = pcVar4 + (0x10 - (uVar7 & 3));
          uVar7 = (*(int *)&this->buffer_end_ - (int)ptr) + 0x10;
          bVar1 = true;
        }
      }
      size = size - uVar6;
    } while (bVar1);
  }
  return (char *)0x0;
}

Assistant:

const char* EpsCopyInputStream::ReadPackedFixed(const char* ptr, int size,
                                                RepeatedField<T>* out) {
  GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
  int nbytes = static_cast<int>(buffer_end_ + kSlopBytes - ptr);
  while (size > nbytes) {
    int num = nbytes / sizeof(T);
    int old_entries = out->size();
    out->Reserve(old_entries + num);
    int block_size = num * sizeof(T);
    auto dst = out->AddNAlreadyReserved(num);
#ifdef ABSL_IS_LITTLE_ENDIAN
    std::memcpy(dst, ptr, block_size);
#else
    for (int i = 0; i < num; i++)
      dst[i] = UnalignedLoad<T>(ptr + i * sizeof(T));
#endif
    size -= block_size;
    if (limit_ <= kSlopBytes) return nullptr;
    ptr = Next();
    if (ptr == nullptr) return nullptr;
    ptr += kSlopBytes - (nbytes - block_size);
    nbytes = static_cast<int>(buffer_end_ + kSlopBytes - ptr);
  }
  int num = size / sizeof(T);
  int block_size = num * sizeof(T);
  if (num == 0) return size == block_size ? ptr : nullptr;
  int old_entries = out->size();
  out->Reserve(old_entries + num);
  auto dst = out->AddNAlreadyReserved(num);
#ifdef ABSL_IS_LITTLE_ENDIAN
  ABSL_CHECK(dst != nullptr) << out << "," << num;
  std::memcpy(dst, ptr, block_size);
#else
  for (int i = 0; i < num; i++) dst[i] = UnalignedLoad<T>(ptr + i * sizeof(T));
#endif
  ptr += block_size;
  if (size != block_size) return nullptr;
  return ptr;
}